

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_exporter.cpp
# Opt level: O2

void Assimp::Write(JSONWriter *out,aiMaterial *ai,bool is_elem)

{
  aiMaterialProperty *s_00;
  uint i;
  long lVar1;
  ulong uVar2;
  allocator<char> local_449;
  ulong local_448;
  aiMaterial *local_440;
  aiString s;
  
  JSONWriter::StartObj(out,is_elem);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s,"properties",&local_449);
  JSONWriter::Key(out,(string *)&s);
  std::__cxx11::string::~string((string *)&s);
  uVar2 = 0;
  JSONWriter::StartArray(out,false);
  local_440 = ai;
  do {
    if (ai->mNumProperties <= uVar2) {
      JSONWriter::EndArray(out);
      JSONWriter::EndObj(out);
      return;
    }
    s_00 = ai->mProperties[uVar2];
    JSONWriter::StartObj(out,true);
    std::__cxx11::string::string<std::allocator<char>>((string *)&s,"key",&local_449);
    JSONWriter::Key(out,(string *)&s);
    std::__cxx11::string::~string((string *)&s);
    JSONWriter::SimpleValue<aiString>(out,&s_00->mKey);
    std::__cxx11::string::string<std::allocator<char>>((string *)&s,"semantic",&local_449);
    JSONWriter::Key(out,(string *)&s);
    std::__cxx11::string::~string((string *)&s);
    JSONWriter::SimpleValue<unsigned_int>(out,&s_00->mSemantic);
    std::__cxx11::string::string<std::allocator<char>>((string *)&s,"index",&local_449);
    JSONWriter::Key(out,(string *)&s);
    std::__cxx11::string::~string((string *)&s);
    JSONWriter::SimpleValue<unsigned_int>(out,&s_00->mIndex);
    std::__cxx11::string::string<std::allocator<char>>((string *)&s,"type",&local_449);
    local_448 = uVar2;
    JSONWriter::Key(out,(string *)&s);
    std::__cxx11::string::~string((string *)&s);
    JSONWriter::SimpleValue<aiPropertyTypeInfo>(out,&s_00->mType);
    std::__cxx11::string::string<std::allocator<char>>((string *)&s,"value",&local_449);
    JSONWriter::Key(out,(string *)&s);
    std::__cxx11::string::~string((string *)&s);
    switch(s_00->mType) {
    case aiPTI_Float:
      if (s_00->mDataLength < 8) {
        JSONWriter::SimpleValue<float>(out,(float *)s_00->mData);
      }
      else {
        JSONWriter::StartArray(out,false);
        lVar1 = 0;
        for (uVar2 = 0; uVar2 < s_00->mDataLength >> 2; uVar2 = uVar2 + 1) {
          JSONWriter::Element<float>(out,(float *)(s_00->mData + lVar1));
          lVar1 = lVar1 + 4;
        }
LAB_003947e8:
        JSONWriter::EndArray(out);
        ai = local_440;
      }
      break;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Assjson/json_exporter.cpp"
                    ,0x1f7,"void Assimp::Write(JSONWriter &, const aiMaterial &, bool)");
    case aiPTI_String:
      s.length = 0;
      s.data[0] = '\0';
      memset(s.data + 1,0x1b,0x3ff);
      aiGetMaterialString(ai,(s_00->mKey).data,s_00->mSemantic,s_00->mIndex,&s);
      JSONWriter::SimpleValue<aiString>(out,&s);
      break;
    case aiPTI_Integer:
      if (7 < s_00->mDataLength) {
        JSONWriter::StartArray(out,false);
        lVar1 = 0;
        for (uVar2 = 0; uVar2 < s_00->mDataLength >> 2; uVar2 = uVar2 + 1) {
          JSONWriter::Element<int>(out,(int *)(s_00->mData + lVar1));
          lVar1 = lVar1 + 4;
        }
        goto LAB_003947e8;
      }
      JSONWriter::SimpleValue<int>(out,(int *)s_00->mData);
      break;
    case aiPTI_Buffer:
      JSONWriter::SimpleValue(out,s_00->mData,(ulong)s_00->mDataLength);
    }
    uVar2 = local_448;
    JSONWriter::EndObj(out);
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

void Write(JSONWriter& out, const aiMaterial& ai, bool is_elem = true) {
    out.StartObj(is_elem);

    out.Key("properties");
    out.StartArray();
    for (unsigned int i = 0; i < ai.mNumProperties; ++i) {
        const aiMaterialProperty* const prop = ai.mProperties[i];
        out.StartObj(true);
        out.Key("key");
        out.SimpleValue(prop->mKey);
        out.Key("semantic");
        out.SimpleValue(prop->mSemantic);
        out.Key("index");
        out.SimpleValue(prop->mIndex);

        out.Key("type");
        out.SimpleValue(prop->mType);

        out.Key("value");
        switch (prop->mType) {
            case aiPTI_Float:
                if (prop->mDataLength / sizeof(float) > 1) {
                    out.StartArray();
                    for (unsigned int i = 0; i < prop->mDataLength / sizeof(float); ++i) {
                        out.Element(reinterpret_cast<float*>(prop->mData)[i]);
                    }
                    out.EndArray();
                }
                else {
                    out.SimpleValue(*reinterpret_cast<float*>(prop->mData));
                }
                break;

            case aiPTI_Integer:
                if (prop->mDataLength / sizeof(int) > 1) {
                    out.StartArray();
                    for (unsigned int i = 0; i < prop->mDataLength / sizeof(int); ++i) {
                        out.Element(reinterpret_cast<int*>(prop->mData)[i]);
                    }
                    out.EndArray();
                } else {
                    out.SimpleValue(*reinterpret_cast<int*>(prop->mData));
                }
                break;

            case aiPTI_String:
                {
                    aiString s;
                    aiGetMaterialString(&ai, prop->mKey.data, prop->mSemantic, prop->mIndex, &s);
                    out.SimpleValue(s);
                }
                break;
            case aiPTI_Buffer:
                {
                    // binary data is written as series of hex-encoded octets
                    out.SimpleValue(prop->mData, prop->mDataLength);
                }
                break;
            default:
                assert(false);
        }

        out.EndObj();
    }

    out.EndArray();
    out.EndObj();
}